

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_changed_ranges.c
# Opt level: O0

void ts_range_array_get_changed_ranges
               (TSRange *old_ranges,uint old_range_count,TSRange *new_ranges,uint new_range_count,
               TSRangeArray *differences)

{
  Length start;
  Length end;
  Length start_00;
  Length end_00;
  Length start_01;
  byte bVar1;
  TSRange *pTVar2;
  TSRange *pTVar3;
  Length LVar4;
  uint32_t uStack_b4;
  uint32_t uStack_b0;
  uint32_t uStack_a8;
  uint32_t uStack_a4;
  undefined1 local_a0 [8];
  Length next_new_position;
  uint32_t uStack_8c;
  uint32_t uStack_84;
  uint32_t uStack_80;
  undefined1 local_7c [8];
  Length next_old_position;
  TSRange *new_range;
  TSRange *old_range;
  undefined1 auStack_58 [6];
  _Bool in_new_range;
  _Bool in_old_range;
  uint32_t local_50;
  undefined1 local_44 [8];
  Length current_position;
  uint old_index;
  uint new_index;
  TSRangeArray *differences_local;
  uint new_range_count_local;
  TSRange *new_ranges_local;
  uint old_range_count_local;
  TSRange *old_ranges_local;
  
  current_position.extent.column = 0;
  current_position.extent.row = 0;
  LVar4 = length_zero();
  _auStack_58 = LVar4._0_8_;
  local_44._0_4_ = auStack_58._0_4_;
  local_44._4_4_ = stack0xffffffffffffffac;
  local_50 = LVar4.extent.column;
  current_position.bytes = local_50;
  bVar1 = 0;
  old_range._6_1_ = 0;
  while (current_position.extent.row < old_range_count ||
         current_position.extent.column < new_range_count) {
    pTVar2 = old_ranges + current_position.extent.row;
    pTVar3 = new_ranges + current_position.extent.column;
    if (bVar1 == 0) {
      if (current_position.extent.row < old_range_count) {
        next_new_position.extent.column = (pTVar2->start_point).row;
        uStack_8c = (pTVar2->start_point).column;
        local_7c._4_4_ = next_new_position.extent.column;
        local_7c._0_4_ = pTVar2->start_byte;
        next_old_position.bytes = uStack_8c;
      }
      else {
        local_7c._0_4_ = 0xffffffff;
        local_7c._4_4_ = 0xffffffff;
        next_old_position.bytes = 0xffffffff;
      }
    }
    else {
      uStack_84 = (pTVar2->end_point).row;
      uStack_80 = (pTVar2->end_point).column;
      local_7c._4_4_ = uStack_84;
      local_7c._0_4_ = pTVar2->end_byte;
      next_old_position.bytes = uStack_80;
    }
    if (old_range._6_1_ == 0) {
      if (current_position.extent.column < new_range_count) {
        uStack_b4 = (pTVar3->start_point).row;
        uStack_b0 = (pTVar3->start_point).column;
        local_a0._4_4_ = uStack_b4;
        local_a0._0_4_ = pTVar3->start_byte;
        next_new_position.bytes = uStack_b0;
      }
      else {
        local_a0._0_4_ = 0xffffffff;
        local_a0._4_4_ = 0xffffffff;
        next_new_position.bytes = 0xffffffff;
      }
    }
    else {
      uStack_a8 = (pTVar3->end_point).row;
      uStack_a4 = (pTVar3->end_point).column;
      local_a0._4_4_ = uStack_a8;
      local_a0._0_4_ = pTVar3->end_byte;
      next_new_position.bytes = uStack_a4;
    }
    if ((uint)local_7c._0_4_ < (uint)local_a0._0_4_) {
      if (bVar1 != old_range._6_1_) {
        start_01.extent.column = current_position.bytes;
        start_01.bytes = local_44._0_4_;
        start_01.extent.row = local_44._4_4_;
        end_00.extent.column = next_old_position.bytes;
        end_00.bytes = local_7c._0_4_;
        end_00.extent.row = local_7c._4_4_;
        ts_range_array_add(differences,start_01,end_00);
      }
      if (bVar1 != 0) {
        current_position.extent.row = current_position.extent.row + 1;
      }
      local_44 = local_7c;
      current_position.bytes = next_old_position.bytes;
      bVar1 = bVar1 ^ 1;
    }
    else {
      if ((uint)local_a0._0_4_ < (uint)local_7c._0_4_) {
        if (bVar1 != old_range._6_1_) {
          start_00.extent.column = current_position.bytes;
          start_00.bytes = local_44._0_4_;
          start_00.extent.row = local_44._4_4_;
          end.extent.column = next_new_position.bytes;
          end.bytes = local_a0._0_4_;
          end.extent.row = local_a0._4_4_;
          ts_range_array_add(differences,start_00,end);
        }
        if (old_range._6_1_ != 0) {
          current_position.extent.column = current_position.extent.column + 1;
        }
      }
      else {
        if (bVar1 != old_range._6_1_) {
          start.extent.column = current_position.bytes;
          start.bytes = local_44._0_4_;
          start.extent.row = local_44._4_4_;
          LVar4.extent.column = next_new_position.bytes;
          LVar4.bytes = local_a0._0_4_;
          LVar4.extent.row = local_a0._4_4_;
          ts_range_array_add(differences,start,LVar4);
        }
        if (bVar1 != 0) {
          current_position.extent.row = current_position.extent.row + 1;
        }
        if (old_range._6_1_ != 0) {
          current_position.extent.column = current_position.extent.column + 1;
        }
        bVar1 = bVar1 ^ 1;
      }
      old_range._6_1_ = old_range._6_1_ ^ 1;
      current_position.bytes = next_new_position.bytes;
      local_44 = local_a0;
    }
  }
  return;
}

Assistant:

void ts_range_array_get_changed_ranges(
  const TSRange *old_ranges, unsigned old_range_count,
  const TSRange *new_ranges, unsigned new_range_count,
  TSRangeArray *differences
) {
  unsigned new_index = 0;
  unsigned old_index = 0;
  Length current_position = length_zero();
  bool in_old_range = false;
  bool in_new_range = false;

  while (old_index < old_range_count || new_index < new_range_count) {
    const TSRange *old_range = &old_ranges[old_index];
    const TSRange *new_range = &new_ranges[new_index];

    Length next_old_position;
    if (in_old_range) {
      next_old_position = (Length) {old_range->end_byte, old_range->end_point};
    } else if (old_index < old_range_count) {
      next_old_position = (Length) {old_range->start_byte, old_range->start_point};
    } else {
      next_old_position = LENGTH_MAX;
    }

    Length next_new_position;
    if (in_new_range) {
      next_new_position = (Length) {new_range->end_byte, new_range->end_point};
    } else if (new_index < new_range_count) {
      next_new_position = (Length) {new_range->start_byte, new_range->start_point};
    } else {
      next_new_position = LENGTH_MAX;
    }

    if (next_old_position.bytes < next_new_position.bytes) {
      if (in_old_range != in_new_range) {
        ts_range_array_add(differences, current_position, next_old_position);
      }
      if (in_old_range) old_index++;
      current_position = next_old_position;
      in_old_range = !in_old_range;
    } else if (next_new_position.bytes < next_old_position.bytes) {
      if (in_old_range != in_new_range) {
        ts_range_array_add(differences, current_position, next_new_position);
      }
      if (in_new_range) new_index++;
      current_position = next_new_position;
      in_new_range = !in_new_range;
    } else {
      if (in_old_range != in_new_range) {
        ts_range_array_add(differences, current_position, next_new_position);
      }
      if (in_old_range) old_index++;
      if (in_new_range) new_index++;
      in_old_range = !in_old_range;
      in_new_range = !in_new_range;
      current_position = next_new_position;
    }
  }
}